

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

int qRegisterMetaType<QDBusObjectPath>(char *typeName)

{
  int iVar1;
  long in_FS_OFFSET;
  QByteArray normalizedTypeName;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0x10] = -0x56;
  local_28[0x11] = -0x56;
  local_28[0x12] = -0x56;
  local_28[0x13] = -0x56;
  local_28[0x14] = -0x56;
  local_28[0x15] = -0x56;
  local_28[0x16] = -0x56;
  local_28[0x17] = -0x56;
  local_28[0] = -0x56;
  local_28[1] = -0x56;
  local_28[2] = -0x56;
  local_28[3] = -0x56;
  local_28[4] = -0x56;
  local_28[5] = -0x56;
  local_28[6] = -0x56;
  local_28[7] = -0x56;
  local_28[8] = -0x56;
  local_28[9] = -0x56;
  local_28[10] = -0x56;
  local_28[0xb] = -0x56;
  local_28[0xc] = -0x56;
  local_28[0xd] = -0x56;
  local_28[0xe] = -0x56;
  local_28[0xf] = -0x56;
  QMetaObject::normalizedType(local_28);
  iVar1 = qRegisterNormalizedMetaType<QDBusObjectPath>((QByteArray *)0x1188e4);
  QByteArray::~QByteArray((QByteArray *)0x1188f2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int qRegisterMetaType(const char *typeName)
{
#ifdef QT_NO_QOBJECT
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = typeName;
#else
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = QMetaObject::normalizedType(typeName);
#endif
    return qRegisterNormalizedMetaType<T>(normalizedTypeName);
}